

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkComputePipelineCreateInfo *pipe,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  VkSpecializationMapEntry *pVVar2;
  bool bVar3;
  VkSpecializationInfo *pVVar4;
  DynamicStateInfo *dynamic_state_info;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *size;
  long lVar5;
  ulong uVar6;
  Value nexts;
  Data local_148;
  VkComputePipelineCreateInfo *local_130;
  Value map_entries;
  Value stage;
  Data local_108;
  Data *local_f0;
  Value map_entry;
  StringRefType local_d8;
  Value spec;
  string local_b0;
  StringRefType local_90;
  StringRefType local_80;
  GenericStringRef<char> local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_108.n.i64 = (Number)0x0;
  local_108.s.str = (Ch *)0x3000000000000;
  local_148._4_1_ = '\0';
  local_148._5_1_ = '\0';
  local_148._6_1_ = '\0';
  local_148._7_1_ = '\0';
  local_148._0_4_ = pipe->flags;
  nexts.data_.s.str = (Ch *)0x405000000159c6f;
  nexts.data_.n = (Number)0x5;
  local_148.s.str = (Ch *)((ulong)(-1 < (int)pipe->flags) << 0x35 | 0x1d6000000000000);
  local_f0 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&nexts,(uint64_t)pipe->layout,alloc);
  local_148.s.str = (Ch *)0x40500000015a33a;
  local_148.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,&nexts,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&nexts,(uint64_t)pipe->basePipelineHandle,alloc);
  local_148.s.str = (Ch *)0x405000000159f52;
  local_148.n = (Number)0x12;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,&nexts,alloc);
  local_40.s = "basePipelineIndex";
  local_40.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_108.s,&local_40,pipe->basePipelineIndex,alloc);
  stage.data_.n = (Number)0x0;
  stage.data_.s.str = (Ch *)0x3000000000000;
  uVar1 = (pipe->stage).flags;
  local_148._4_1_ = '\0';
  local_148._5_1_ = '\0';
  local_148._6_1_ = '\0';
  local_148._7_1_ = '\0';
  local_148._0_4_ = uVar1;
  nexts.data_.s.str = (Ch *)0x405000000159c6f;
  nexts.data_.n = (Number)0x5;
  local_148.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&stage,&nexts,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,alloc);
  local_50.s = "stage";
  local_50.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkShaderStageFlagBits>(&stage,&local_50,(pipe->stage).stage,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&nexts,(uint64_t)(pipe->stage).module,alloc);
  local_148.s.str = (Ch *)0x405000000159f72;
  local_148.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_148.s,&nexts,alloc);
  local_60.s = "name";
  local_60.length = 4;
  local_70.s = (pipe->stage).pName;
  local_70.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_70,local_70.s);
  dynamic_state_info = (DynamicStateInfo *)alloc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&stage,&local_60,&local_70,alloc);
  pVVar4 = (pipe->stage).pSpecializationInfo;
  if (pVVar4 != (VkSpecializationInfo *)0x0) {
    spec.data_.n = (Number)0x0;
    spec.data_.s.str = (Ch *)0x3000000000000;
    local_80.s = "dataSize";
    local_80.length = 8;
    size = alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_long>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&spec,&local_80,pVVar4->dataSize,alloc);
    local_90.s = "data";
    local_90.length = 4;
    pVVar4 = (pipe->stage).pSpecializationInfo;
    local_130 = pipe;
    encode_base64_abi_cxx11_
              (&local_b0,(Fossilize *)pVVar4->pData,(void *)pVVar4->dataSize,(size_t)size);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    AddMember<std::__cxx11::string>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&spec,&local_90,&local_b0,alloc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    map_entries.data_.n = (Number)0x0;
    map_entries.data_.s.str = (Ch *)0x4000000000000;
    pVVar4 = (local_130->stage).pSpecializationInfo;
    pipe = local_130;
    if (pVVar4->mapEntryCount != 0) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        pVVar2 = pVVar4->pMapEntries;
        map_entry.data_.n = (Number)0x0;
        map_entry.data_.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)pVVar2 + lVar5 + -4);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = uVar1;
        nexts.data_.s.str = (Ch *)0x405000000159c52;
        nexts.data_.n = (Number)0x6;
        local_148.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&map_entry,&nexts,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148.s,alloc);
        local_d8.s = "size";
        local_d8.length = 4;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  (&map_entry,&local_d8,*(unsigned_long *)((long)&pVVar2->constantID + lVar5),alloc)
        ;
        pipe = local_130;
        uVar1 = *(uint *)((long)pVVar2 + lVar5 + -8);
        local_148._4_1_ = '\0';
        local_148._5_1_ = '\0';
        local_148._6_1_ = '\0';
        local_148._7_1_ = '\0';
        local_148._0_4_ = uVar1;
        nexts.data_.s.str = (Ch *)0x405000000159f1c;
        nexts.data_.n = (Number)0xa;
        local_148.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&map_entry,&nexts,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148.s,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&map_entries,&map_entry,alloc);
        uVar6 = uVar6 + 1;
        pVVar4 = (pipe->stage).pSpecializationInfo;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < pVVar4->mapEntryCount);
    }
    local_148.s.str = (Ch *)0x405000000159f35;
    local_148.n = (Number)0xa;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&spec,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_148.s,&map_entries,alloc);
    local_148.s.str = (Ch *)0x405000000159f79;
    local_148.n.i64 = (Number)0x12;
    dynamic_state_info = (DynamicStateInfo *)alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_148.s,&spec,alloc);
  }
  bVar3 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (&stage,(VkPipelineShaderStageCreateInfo *)(pipe->stage).pNext,alloc,
                     dynamic_state_info);
  if (bVar3) {
    local_148.s.str = (Ch *)0x405000000159f65;
    local_148.n = (Number)0x5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_108.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_148.s,&stage,alloc);
    if (pipe->pNext != (void *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,&nexts,(DynamicStateInfo *)0x0);
      if (!bVar3) goto LAB_0010e8de;
      local_148.s.str = (Ch *)0x405000000159d25;
      local_148.n = (Number)0x5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_108.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_148.s,&nexts,alloc);
    }
    bVar3 = true;
    if (&local_108 != local_f0) {
      local_f0->n = local_108.n;
      (&local_f0->n)[1] = (Number)local_108.s.str;
    }
  }
  else {
LAB_0010e8de:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool json_value(const VkComputePipelineCreateInfo& pipe, Allocator& alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	Value stage(kObjectType);
	stage.AddMember("flags", pipe.stage.flags, alloc);
	stage.AddMember("stage", pipe.stage.stage, alloc);
	stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(pipe.stage.module), alloc), alloc);
	stage.AddMember("name", StringRef(pipe.stage.pName), alloc);
	if (pipe.stage.pSpecializationInfo)
	{
		Value spec(kObjectType);
		spec.AddMember("dataSize", uint64_t(pipe.stage.pSpecializationInfo->dataSize), alloc);
		spec.AddMember("data",
		               encode_base64(pipe.stage.pSpecializationInfo->pData,
		                             pipe.stage.pSpecializationInfo->dataSize), alloc);
		Value map_entries(kArrayType);
		for (uint32_t i = 0; i < pipe.stage.pSpecializationInfo->mapEntryCount; i++)
		{
			auto &e = pipe.stage.pSpecializationInfo->pMapEntries[i];
			Value map_entry(kObjectType);
			map_entry.AddMember("offset", e.offset, alloc);
			map_entry.AddMember("size", uint64_t(e.size), alloc);
			map_entry.AddMember("constantID", e.constantID, alloc);
			map_entries.PushBack(map_entry, alloc);
		}
		spec.AddMember("mapEntries", map_entries, alloc);
		stage.AddMember("specializationInfo", spec, alloc);
	}

	if (!pnext_chain_add_json_value(stage, pipe.stage, alloc, nullptr))
		return false;
	p.AddMember("stage", stage, alloc);

	if (!pnext_chain_add_json_value(p, pipe, alloc, nullptr))
		return false;

	*out_value = p;
	return true;
}